

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_detail.h
# Opt level: O1

void __thiscall
st_tree::detail::max_maintainer<unsigned_long,_std::allocator<int>_>::insert
          (max_maintainer<unsigned_long,_std::allocator<int>_> *this,unsigned_long *n)

{
  pointer puVar1;
  value_type_conflict2 local_18;
  
  if ((ulong)((long)(this->_hist).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_hist).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) <= *n) {
    local_18 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->_hist,*n + 1,&local_18);
  }
  puVar1 = (this->_hist).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + *n;
  *puVar1 = *puVar1 + 1;
  if (this->_max < *n) {
    this->_max = *n;
  }
  return;
}

Assistant:

void insert(const Unsigned& n) {
        if (n >= _hist.size()) _hist.resize(1+n, 0);
        _hist[n] += 1;
        if (n > _max) _max = n;
    }